

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O2

void * TtfUtil::FindCmapSubtable(void *pCmap,int nPlatformId,int nEncodingId)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    if ((ushort)(*(ushort *)((long)pCmap + 2) << 8 | *(ushort *)((long)pCmap + 2) >> 8) == uVar3) {
      return (void *)0x0;
    }
    uVar1 = *(ushort *)((long)pCmap + uVar3 * 8 + 4);
    if (((uint)(ushort)(uVar1 << 8 | uVar1 >> 8) == nPlatformId) &&
       ((nEncodingId == -1 ||
        (uVar1 = *(ushort *)((long)pCmap + uVar3 * 8 + 6),
        (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) == nEncodingId)))) break;
    uVar3 = uVar3 + 1;
  }
  uVar2 = *(uint *)((long)pCmap + uVar3 * 8 + 8);
  return (void *)((ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18) + (long)pCmap);
}

Assistant:

void * FindCmapSubtable(const void * pCmap, 
								 int nPlatformId, /* =3 */
								 int nEncodingId) /* = 1 */
{
	const Sfnt::CharacterCodeMap * pTable = 
		reinterpret_cast<const Sfnt::CharacterCodeMap *>(pCmap);
	
	uint16 csuPlatforms = read(pTable->num_subtables);
	for (int i = 0; i < csuPlatforms; i++)
	{
		if (read(pTable->encoding[i].platform_id) == nPlatformId &&
			(nEncodingId == -1 || read(pTable->encoding[i].platform_specific_id) == nEncodingId))
		{
			const void * pRtn = reinterpret_cast<const uint8 *>(pCmap) + 
				read(pTable->encoding[i].offset);
			return const_cast<void *>(pRtn);
		}
	}

	return 0;
}